

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

vector<MapConnection_*,_std::allocator<MapConnection_*>_> * __thiscall
World::map_connections
          (vector<MapConnection_*,_std::allocator<MapConnection_*>_> *__return_storage_ptr__,
          World *this,uint16_t map_id_1,uint16_t map_id_2)

{
  pointer pMVar1;
  MapConnection *connection;
  pointer pMVar2;
  pointer local_38;
  
  (__return_storage_ptr__->super__Vector_base<MapConnection_*,_std::allocator<MapConnection_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MapConnection_*,_std::allocator<MapConnection_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MapConnection_*,_std::allocator<MapConnection_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar1 = (this->_map_connections).
           super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar2 = (this->_map_connections).
                super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar2 != pMVar1; pMVar2 = pMVar2 + 1) {
    if ((pMVar2->_map_id_1 == map_id_1) && (pMVar2->_map_id_2 == map_id_2)) {
      local_38 = pMVar2;
      std::vector<MapConnection*,std::allocator<MapConnection*>>::emplace_back<MapConnection*>
                ((vector<MapConnection*,std::allocator<MapConnection*>> *)__return_storage_ptr__,
                 &local_38);
    }
    if ((pMVar2->_map_id_1 == map_id_2) && (pMVar2->_map_id_2 == map_id_1)) {
      local_38 = pMVar2;
      std::vector<MapConnection*,std::allocator<MapConnection*>>::emplace_back<MapConnection*>
                ((vector<MapConnection*,std::allocator<MapConnection*>> *)__return_storage_ptr__,
                 &local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MapConnection*> World::map_connections(uint16_t map_id_1, uint16_t map_id_2)
{
    std::vector<MapConnection*> connections;
    for(MapConnection& connection : _map_connections)
    {
        if(connection.map_id_1() == map_id_1 && connection.map_id_2() == map_id_2)
            connections.emplace_back(&connection);
        if(connection.map_id_1() == map_id_2 && connection.map_id_2() == map_id_1)
            connections.emplace_back(&connection);
    }

    return connections;
}